

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.h
# Opt level: O2

HitWriter<Protein> * __thiscall
Alnout::Writer<Protein>::operator<<(Writer<Protein> *this,QueryHitsPair<Protein> *queryWithHits)

{
  Sequence<Protein> *query;
  ostream *poVar1;
  _Elt_pointer pHVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  ostream *poVar5;
  _Map_pointer ppaVar6;
  unsigned_long uVar7;
  _Map_pointer ppHVar8;
  Hit<Protein> *hit_00;
  Hit<Protein> *hit_01;
  Hit<Protein> *hit;
  _Elt_pointer pHVar9;
  _Alloc_hider _Var10;
  long lVar11;
  string *psVar12;
  _Elt_pointer paVar13;
  _Elt_pointer pHVar14;
  float fVar15;
  initializer_list<unsigned_long> __l;
  string tstrand;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [8];
  string queryLen;
  string targetLen;
  string qstrand;
  undefined1 local_100 [8];
  AlignmentLines lines;
  size_t numCols;
  string local_90;
  ulong local_70;
  size_t numMatches;
  size_t numGaps;
  _Elt_pointer local_58;
  _Elt_pointer local_50;
  _Elt_pointer local_48;
  QueryHitsPair<Protein> *local_40;
  _Elt_pointer local_38;
  
  poVar1 = (this->super_HitWriter<Protein>).mOutput;
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) | 4;
  poVar5 = std::operator<<(poVar1,"Query >");
  poVar5 = std::operator<<(poVar5,(string *)queryWithHits);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar1," %Id   TLen  Target");
  std::endl<char,std::char_traits<char>>(poVar5);
  pHVar9 = (queryWithHits->second).super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  pHVar14 = (queryWithHits->second).super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>.
            _M_impl.super__Deque_impl_data._M_start._M_last;
  local_38 = (_Elt_pointer)
             (queryWithHits->second).super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  pHVar2 = (queryWithHits->second).super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_40 = queryWithHits;
  while (pHVar9 != pHVar2) {
    lVar11 = *(long *)poVar1;
    *(undefined8 *)(poVar1 + *(long *)(lVar11 + -0x18) + 8) = 0;
    *(undefined8 *)(poVar1 + *(long *)(lVar11 + -0x18) + 0x10) = 3;
    fVar15 = Cigar::Identity(&pHVar9->alignment);
    poVar5 = std::ostream::_M_insert<double>((double)fVar15 * 100.0);
    poVar5 = std::operator<<(poVar5,'%');
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 7;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = std::operator<<(poVar5,(string *)pHVar9);
    std::endl<char,std::char_traits<char>>(poVar5);
    pHVar9 = pHVar9 + 1;
    if (pHVar9 == pHVar14) {
      pHVar9 = *(_Map_pointer)((long)local_38 + 8);
      local_38 = (_Elt_pointer)((long)local_38 + 8);
      pHVar14 = pHVar9 + 2;
    }
  }
  std::endl<char,std::char_traits<char>>(poVar1);
  pHVar14 = (local_40->second).super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  local_58 = (local_40->second).super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
  ppHVar8 = (local_40->second).super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node;
  pHVar9 = (local_40->second).super__Deque_base<Hit<Protein>,_std::allocator<Hit<Protein>_>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  while( true ) {
    if (pHVar14 == pHVar9) break;
    std::__cxx11::to_string((string *)local_1a0,(local_40->first).sequence._M_string_length);
    local_38 = pHVar14;
    std::__cxx11::to_string
              ((string *)((long)&queryLen.field_2 + 8),(pHVar14->target).sequence._M_string_length);
    _Var10 = targetLen._M_dataplus;
    _Var3 = queryLen._M_dataplus;
    poVar5 = std::operator<<(poVar1," Query");
    if (_Var10._M_p < _Var3._M_p) {
      _Var10 = _Var3;
    }
    lVar11 = (long)((int)_Var10._M_p + 1);
    *(long *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = lVar11;
    std::__cxx11::to_string
              ((string *)(targetLen.field_2._M_local_buf + 8),
               (local_40->first).sequence._M_string_length);
    poVar5 = std::operator<<(poVar5,(string *)(targetLen.field_2._M_local_buf + 8));
    Unit_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,(string *)&stack0xfffffffffffffdc0);
    poVar5 = std::operator<<(poVar5," >");
    poVar5 = std::operator<<(poVar5,(string *)local_40);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
    psVar12 = (string *)(targetLen.field_2._M_local_buf + 8);
    std::__cxx11::string::~string((string *)psVar12);
    poVar5 = std::operator<<(poVar1,"Target");
    pHVar14 = local_38;
    *(long *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = lVar11;
    std::__cxx11::to_string(psVar12,(local_38->target).sequence._M_string_length);
    poVar5 = std::operator<<(poVar5,(string *)psVar12);
    Unit_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,(string *)&stack0xfffffffffffffdc0);
    poVar5 = std::operator<<(poVar5," >");
    poVar5 = std::operator<<(poVar5,(string *)pHVar14);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
    std::__cxx11::string::~string((string *)(targetLen.field_2._M_local_buf + 8));
    Sequence<Protein>::Sequence
              ((Sequence<Protein> *)(targetLen.field_2._M_local_buf + 8),&local_40->first);
    Sequence<Protein>::Sequence((Sequence<Protein> *)&stack0xfffffffffffffdc0,&pHVar14->target);
    query = (Sequence<Protein> *)((long)&targetLen.field_2 + 8);
    ExtractAlignmentLines
              ((AlignmentLines *)local_100,query,(Sequence<Protein> *)&stack0xfffffffffffffdc0,
               &pHVar14->alignment,
               (size_t *)
               &lines.
                super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_70,&numMatches);
    Sequence<Protein>::~Sequence((Sequence<Protein> *)&stack0xfffffffffffffdc0);
    Sequence<Protein>::~Sequence(query);
    std::endl<char,std::char_traits<char>>(poVar1);
    local_48 = lines.
               super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
               ._M_impl.super__Deque_impl_data._M_start._M_first;
    numGaps = (size_t)lines.
                      super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_50 = (_Elt_pointer)
               lines.
               super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    paVar13 = (_Elt_pointer)
              lines.
              super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
              ._M_impl.super__Deque_impl_data._M_map_size;
    while( true ) {
      pHVar14 = local_38;
      psVar12 = (string *)((long)&targetLen.field_2 + 8);
      if (paVar13 == local_50) break;
      ppaVar6 = lines.
                super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      if ((_Elt_pointer)
          lines.
          super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node ==
          lines.
          super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        ppaVar6 = (_Map_pointer)
                  (*(long *)((long)&lines.
                                    super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].a.field_2
                            + 8) + 0x200);
      }
      std::__cxx11::to_string((string *)&stack0xfffffffffffffdc0,(unsigned_long)ppaVar6[-0x10]);
      targetLen.field_2._8_8_ = tstrand._M_dataplus._M_p;
      ppaVar6 = lines.
                super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      if ((_Elt_pointer)
          lines.
          super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node ==
          lines.
          super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        ppaVar6 = (_Map_pointer)
                  (*(long *)((long)&lines.
                                    super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].a.field_2
                            + 8) + 0x200);
      }
      std::__cxx11::to_string(&local_90,(unsigned_long)ppaVar6[-10]);
      sVar4 = local_90._M_string_length;
      ppaVar6 = lines.
                super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      if ((_Elt_pointer)
          lines.
          super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node ==
          lines.
          super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        ppaVar6 = (_Map_pointer)
                  (*(long *)((long)&lines.
                                    super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].a.field_2
                            + 8) + 0x200);
      }
      std::__cxx11::to_string(&local_1e0,(unsigned_long)ppaVar6[-0xf]);
      ppaVar6 = lines.
                super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      if ((_Elt_pointer)
          lines.
          super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node ==
          lines.
          super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        ppaVar6 = (_Map_pointer)
                  (*(long *)((long)&lines.
                                    super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].a.field_2
                            + 8) + 0x200);
      }
      std::__cxx11::to_string(&local_1c0,(unsigned_long)ppaVar6[-9]);
      __l._M_len = 4;
      __l._M_array = (iterator)psVar12;
      uVar7 = std::max<unsigned_long>(__l);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
      pHVar14 = local_38;
      QueryStrand_abi_cxx11_(psVar12,(Writer<Protein> *)local_38,hit_00);
      TargetStrand_abi_cxx11_((string *)&stack0xfffffffffffffdc0,(Writer<Protein> *)pHVar14,hit_01);
      if (sVar4 != 0) {
        std::__cxx11::string::append(targetLen.field_2._M_local_buf + 8);
      }
      if (tstrand._M_dataplus._M_p != (pointer)0x0) {
        std::__cxx11::string::append((char *)&stack0xfffffffffffffdc0);
      }
      poVar5 = std::operator<<(poVar1,"Qry ");
      *(long *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = (long)(int)uVar7;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,(string *)(targetLen.field_2._M_local_buf + 8));
      poVar5 = std::operator<<(poVar5,(string *)&paVar13->q);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar7 + (char)sVar4 + '\x05');
      poVar5 = std::operator<<(poVar1,(string *)&local_90);
      poVar5 = std::operator<<(poVar5,(string *)&paVar13->a);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&local_90);
      poVar5 = std::operator<<(poVar1,"Tgt ");
      *(long *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = (long)(int)uVar7;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,(string *)&stack0xfffffffffffffdc0);
      poVar5 = std::operator<<(poVar5,(string *)&paVar13->t);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
      std::__cxx11::string::~string((string *)(targetLen.field_2._M_local_buf + 8));
      paVar13 = paVar13 + 1;
      if (paVar13 == local_48) {
        paVar13 = *(_Elt_pointer *)(numGaps + 8);
        numGaps = numGaps + 8;
        local_48 = paVar13 + 4;
      }
    }
    local_50 = (_Elt_pointer)CONCAT44(local_50._4_4_,(float)local_70);
    local_38 = (_Elt_pointer)
               CONCAT44(local_38._4_4_,
                        (float)lines.
                               super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node);
    local_48 = (_Elt_pointer)CONCAT44(local_48._4_4_,(float)numMatches);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar5 = std::operator<<(poVar5," cols, ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," ids (");
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8) = 1;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(local_50._0_4_ / local_38._0_4_) * 100.0);
    poVar5 = std::operator<<(poVar5,"%), ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," gaps (");
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8) = 1;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(local_48._0_4_ / local_38._0_4_) * 100.0);
    poVar5 = std::operator<<(poVar5,"%)");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::
    deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
    ::~deque((deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
              *)local_100);
    std::__cxx11::string::~string((string *)(queryLen.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_1a0);
    pHVar14 = pHVar14 + 1;
    if (pHVar14 == local_58) {
      pHVar14 = ppHVar8[1];
      ppHVar8 = ppHVar8 + 1;
      local_58 = pHVar14 + 2;
    }
  }
  return &this->super_HitWriter<Protein>;
}

Assistant:

HitWriter< Alphabet >&
  operator<<( const QueryHitsPair< Alphabet >& queryWithHits ) {
    const auto& query = queryWithHits.first;
    const auto& hits  = queryWithHits.second;

    auto& out = this->mOutput;

    // Output with fixed precision (sticky)
    out << std::setiosflags( std::ios::fixed );

    out << "Query >" << query.identifier << std::endl;
    out << " %Id   TLen  Target" << std::endl;
    for( auto& hit : hits ) {
      out << std::setprecision( 0 ) << std::setw( 3 )
              << ( hit.alignment.Identity() * 100.0 ) << '%' << std::setw( 7 )
              << hit.target.Length() << "  " << hit.target.identifier
              << std::endl;
    }
    out << std::endl;

    for( const auto& hit : hits ) {
      auto queryLen  = std::to_string( query.Length() );
      auto targetLen = std::to_string( hit.target.Length() );
      auto maxLen    = std::max( queryLen.size(), targetLen.size() );

      out << " Query" << std::setw( maxLen + 1 )
              << std::to_string( query.Length() ) << Unit() << " >"
              << query.identifier << std::endl;
      out << "Target" << std::setw( maxLen + 1 )
              << std::to_string( hit.target.Length() ) << Unit() << " >"
              << hit.target.identifier << std::endl;

      size_t numCols, numMatches, numGaps;
      auto   lines = ExtractAlignmentLines(
        QueryForAlignment( hit, query ), TargetForAlignment( hit, query ), hit.alignment,
        &numCols, &numMatches, &numGaps );

      out << std::endl;
      for( auto& line : lines ) {
        auto padLen = std::max( { std::to_string( lines.back().qs ).size(),
                                  std::to_string( lines.back().ts ).size(),
                                  std::to_string( lines.back().qe ).size(),
                                  std::to_string( lines.back().te ).size() } );

        auto qstrand = QueryStrand( hit );
        auto tstrand = TargetStrand( hit );

        if( !qstrand.empty() )
          qstrand += " ";

        if( !tstrand.empty() )
          tstrand += " ";

        out << "Qry " << std::setw( padLen )
                << QueryPos( line.qs, query, hit )
                << " " << qstrand << line.q << " "
                << QueryPos( line.qe, query, hit ) << std::endl;

        out << std::string( 5 + padLen + qstrand.size(), ' ' ) << line.a
                << std::endl;

        out << "Tgt " << std::setw( padLen )
                << TargetPos( line.ts, query, hit )
                << " " << tstrand << line.t << " "
                << TargetPos( line.te, query, hit ) << std::endl;

        out << std::endl;
      }

      float identity  = float( numMatches ) / float( numCols );
      float gapsRatio = float( numGaps ) / float( numCols );
      out << numCols << " cols, " << numMatches << " ids ("
              << std::setprecision( 1 ) << ( 100.0f * identity ) << "%), "
              << numGaps << " gaps (" << std::setprecision( 1 )
              << ( 100.0f * gapsRatio ) << "%)" << std::endl;

      out << std::endl;
    }
    return *this;
  }